

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_ii_op(function *fn,int A,int B,int C,int pc,char *op)

{
  TValue *pTVar1;
  TValue *Konst1_1;
  TValue *Konst1;
  char *op_local;
  int pc_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  if ((B & 0x80U) == 0) {
    if ((C & 0x80U) == 0) {
      emit_reg_or_k(fn,"rb",B);
      emit_reg_or_k(fn,"rc",C);
      membuff_add_fstring(&fn->body,"setivalue(ra, ivalue(rb) %s ivalue(rc));\n",op);
    }
    else {
      pTVar1 = fn->p->k;
      emit_reg_or_k(fn,"rb",B);
      membuff_add_fstring(&fn->body,"setivalue(ra, ivalue(rb) %s %lld);\n",op,
                          pTVar1[(int)(C & 0xffffff7f)].value_.gc);
    }
  }
  else {
    pTVar1 = fn->p->k;
    emit_reg_or_k(fn,"rc",C);
    membuff_add_fstring(&fn->body,"setivalue(ra, %lld %s ivalue(rc));\n",
                        pTVar1[(int)(B & 0xffffff7f)].value_.gc,op);
  }
  return;
}

Assistant:

static void emit_ii_op(struct function *fn, int A, int B, int C, int pc, const char *op) {
  (void)pc;
  emit_reg(fn, "ra", A);
  if (ISK(B)) {
    TValue *Konst1 = &fn->p->k[INDEXK(B)];
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setivalue(ra, %lld %s ivalue(rc));\n", Konst1->value_.i, op);
  }
  else if (ISK(C)) {
    TValue *Konst1 = &fn->p->k[INDEXK(C)];
    emit_reg_or_k(fn, "rb", B);
    membuff_add_fstring(&fn->body, "setivalue(ra, ivalue(rb) %s %lld);\n", op, Konst1->value_.i);
  }
  else {
    emit_reg_or_k(fn, "rb", B);
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setivalue(ra, ivalue(rb) %s ivalue(rc));\n", op);
  }
}